

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.h
# Opt level: O0

void __thiscall cmLinkImplItem::~cmLinkImplItem(cmLinkImplItem *this)

{
  cmLinkImplItem *this_local;
  
  cmListFileBacktrace::~cmListFileBacktrace(&this->Backtrace);
  cmLinkItem::~cmLinkItem(&this->super_cmLinkItem);
  return;
}

Assistant:

cmLinkImplItem(): cmLinkItem(), Backtrace(), FromGenex(false) {}